

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadEscape
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *startingLocation,
          EncodedCharPtr endOfSource,codepoint_t *outChar)

{
  code *pcVar1;
  bool bVar2;
  OLECHAR OVar3;
  uint uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  int local_4c;
  uint maxHexDigits;
  int hexValue;
  OLECHAR ch;
  uint i;
  bool expectCurly;
  codepoint_t *pcStack_38;
  codepoint_t charToOutput;
  EncodedCharPtr currentLocation;
  codepoint_t *outChar_local;
  EncodedCharPtr endOfSource_local;
  EncodedCharPtr *startingLocation_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  currentLocation = (EncodedCharPtr)outChar;
  outChar_local = (codepoint_t *)endOfSource;
  endOfSource_local = (EncodedCharPtr)startingLocation;
  startingLocation_local = (EncodedCharPtr *)this;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10c,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (outChar_local < *(codepoint_t **)endOfSource_local) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10d,"(startingLocation <= endOfSource)","startingLocation <= endOfSource")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pcStack_38 = *(codepoint_t **)endOfSource_local;
  i = 0;
  if ((pcStack_38 < outChar_local) &&
     (OVar3 = UTF8EncodingPolicyBase<false>::ReadFirst
                        ((EncodedCharPtr *)&stack0xffffffffffffffc8,(EncodedCharPtr)outChar_local),
     OVar3 == L'u')) {
    ch._1_1_ = 0;
    if (((pcStack_38 < outChar_local) &&
        (OVar3 = UTF8EncodingPolicyBase<false>::PeekFirst
                           ((EncodedCharPtr)pcStack_38,(EncodedCharPtr)outChar_local), OVar3 == L'{'
        )) && ((this->es6UnicodeMode & 1U) != 0)) {
      ch._1_1_ = 1;
      UTF8EncodingPolicyBase<false>::ReadFirst
                ((EncodedCharPtr *)&stack0xffffffffffffffc8,(EncodedCharPtr)outChar_local);
    }
    hexValue = 0;
    maxHexDigits._2_2_ = L'\0';
    local_4c = 0;
    uVar4 = 4;
    if ((ch._1_1_ & 1) != 0) {
      uVar4 = 0xffffffff;
    }
    for (; (uint)hexValue < uVar4 && pcStack_38 < outChar_local; hexValue = hexValue + 1) {
      maxHexDigits._2_2_ =
           UTF8EncodingPolicyBase<false>::ReadFirst
                     ((EncodedCharPtr *)&stack0xffffffffffffffc8,(EncodedCharPtr)outChar_local);
      BVar5 = Js::NumberUtilities::FHexDigit(maxHexDigits._2_2_,&local_4c);
      if (BVar5 == 0) break;
      i = i * 0x10 + local_4c;
      if (0x10ffff < i) {
        return false;
      }
    }
    if ((hexValue == 0) || ((hexValue != 4 && ((ch._1_1_ & 1) == 0)))) {
      this_local._7_1_ = false;
    }
    else {
      if (((ch._1_1_ & 1) != 0) && ((this->es6UnicodeMode & 1U) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x13c,"(expectCurly ? es6UnicodeMode : true)",
                           "expectCurly ? es6UnicodeMode : true");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (((ch._1_1_ & 1) == 0) || (maxHexDigits._2_2_ == L'}')) {
        *(uint *)currentLocation = i;
        *(codepoint_t **)endOfSource_local = pcStack_38;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadEscape(EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar)
{
    Assert(outChar != nullptr);
    Assert(startingLocation <= endOfSource);

    EncodedCharPtr currentLocation = startingLocation;
    codepoint_t charToOutput = 0x0;

    // '\' is Assumed as there is only one caller
    // Read 'u' characters
    if (currentLocation >= endOfSource || this->ReadFirst(currentLocation, endOfSource) != 'u')
    {
        return false;
    }

    bool expectCurly = false;

    if (currentLocation < endOfSource && this->PeekFirst(currentLocation, endOfSource) == '{' && es6UnicodeMode)
    {
        expectCurly = true;
        // Move past the character
        this->ReadFirst(currentLocation, endOfSource);
    }

    uint i = 0;
    OLECHAR ch = 0;
    int hexValue = 0;
    uint maxHexDigits = (expectCurly ? MAXUINT32 : 4u);

    for(; i < maxHexDigits && currentLocation < endOfSource; i++)
    {
        if (!Js::NumberUtilities::FHexDigit(ch = this->ReadFirst(currentLocation, endOfSource), &hexValue))
        {
            break;
        }

        charToOutput = charToOutput * 0x10 + hexValue;

        if (charToOutput > 0x10FFFF)
        {
            return false;
        }
    }

    //At least 4 characters have to be read
    if (i == 0 || (i != 4 && !expectCurly))
    {
        return false;
    }

    Assert(expectCurly ? es6UnicodeMode : true);

    if (expectCurly && ch != '}')
    {
        return false;
    }

    *outChar = charToOutput;
    startingLocation = currentLocation;
    return true;
}